

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_CustomRailgun
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *this;
  uint uVar2;
  int iVar3;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 *paVar4;
  VMValue *pVVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  TAngle<double> *other;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  bool local_22b;
  undefined1 local_228 [8];
  FRailParams p;
  TAngle<double> local_1a0;
  TAngle<double> local_198;
  TAngle<double> local_190;
  TAngle<double> local_188;
  TAngle<double> local_180;
  DAngle rnd;
  undefined1 local_170 [8];
  undefined1 local_168 [32];
  TAngle<double> local_148;
  DThinker *local_140;
  double zdiff;
  DVector2 xydiff;
  TAngle<double> local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [12];
  TFlags<ActorFlag,_unsigned_int> local_fc;
  TAngle<double> local_f8;
  DAngle saved_pitch;
  DAngle saved_angle;
  DVector3 savedpos;
  FTranslatedLineTarget t;
  int limit;
  int SpiralOffset;
  double spawnofs_z;
  MetaClass *spawnclass;
  double driftspeed;
  double sparsity;
  DAngle DStack_80;
  int duration;
  double range;
  DAngle spread_z;
  DAngle spread_xy;
  MetaClass *pufftype;
  double maxdiff;
  int aim;
  int flags;
  PalEntry color2;
  PalEntry color1;
  int spawnofs_xy;
  int damage;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x8cd,
                  "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar8 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar8 = true, (param->field_0).field_1.atag != 1)) {
    bVar8 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar8) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x8cd,
                  "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = *(AActor **)&param->field_0;
  local_22b = true;
  if (this != (AActor *)0x0) {
    local_22b = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_22b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x8cd,
                  "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x8ce,
                  "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type == '\0') {
    iVar1 = param[1].field_0.i;
    if (numparam < 3) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar5->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8cf,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      paVar4 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 *)
               TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      color2.field_0.field_0 = *(anon_union_4_2_12391d7c_for_PalEntry_0 *)paVar4;
    }
    else {
      if (param[2].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8cf,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      color2.field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
            &((anon_union_4_2_12391d7c_for_PalEntry_0 *)(param + 2))->field_0;
    }
    PalEntry::PalEntry((PalEntry *)&flags);
    if (numparam < 4) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar5->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d0,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      PalEntry::operator=((PalEntry *)&flags,(pVVar5->field_0).i);
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d0,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      PalEntry::operator=((PalEntry *)&flags,param[3].field_0.i);
    }
    PalEntry::PalEntry((PalEntry *)&aim);
    if (numparam < 5) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar5->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d1,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      PalEntry::operator=((PalEntry *)&aim,(pVVar5->field_0).i);
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d1,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      PalEntry::operator=((PalEntry *)&aim,param[4].field_0.i);
    }
    if (numparam < 6) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      if ((pVVar5->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d2,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      maxdiff._4_4_ = (pVVar5->field_0).i;
    }
    else {
      if (param[5].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d2,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      maxdiff._4_4_ = param[5].field_0.i;
    }
    if (numparam < 7) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      if ((pVVar5->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d3,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      maxdiff._0_4_ = (pVVar5->field_0).i;
    }
    else {
      if (param[6].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d3,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      maxdiff._0_4_ = param[6].field_0.i;
    }
    if (numparam < 8) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      if ((pVVar5->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d4,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      pufftype = (MetaClass *)(pVVar5->field_0).field_1.a;
    }
    else {
      if (param[7].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d4,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pufftype = (MetaClass *)param[7].field_0.field_1.a;
    }
    if (numparam < 9) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      bVar8 = false;
      if ((pVVar5->field_0).field_3.Type == '\x03') {
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
        bVar8 = true;
        if ((pVVar5->field_0).field_1.atag != 1) {
          pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
          bVar8 = (pVVar5->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar8) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d5,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      spread_xy.Degrees = (double)(pVVar5->field_0).field_1.a;
    }
    else {
      bVar8 = false;
      if ((param[8].field_0.field_3.Type == '\x03') &&
         (bVar8 = true, param[8].field_0.field_1.atag != 1)) {
        bVar8 = param[8].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar8) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d5,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      spread_xy.Degrees = (double)param[8].field_0.field_1.a;
    }
    TAngle<double>::TAngle(&spread_z);
    if (numparam < 10) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
      if ((pVVar5->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d6,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
      TAngle<double>::operator=(&spread_z,(pVVar5->field_0).f);
    }
    else {
      if (param[9].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d6,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      TAngle<double>::operator=(&spread_z,param[9].field_0.f);
    }
    TAngle<double>::TAngle((TAngle<double> *)&range);
    if (numparam < 0xb) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
      if ((pVVar5->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d7,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
      TAngle<double>::operator=((TAngle<double> *)&range,(pVVar5->field_0).f);
    }
    else {
      if (param[10].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d7,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      TAngle<double>::operator=((TAngle<double> *)&range,param[10].field_0.f);
    }
    if (numparam < 0xc) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
      if ((pVVar5->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d8,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
      DStack_80.Degrees = (pVVar5->field_0).f;
    }
    else {
      if (param[0xb].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d8,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      DStack_80.Degrees = param[0xb].field_0.f;
    }
    if (numparam < 0xd) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
      if ((pVVar5->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d9,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
      sparsity._4_4_ = (pVVar5->field_0).i;
    }
    else {
      if (param[0xc].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8d9,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      sparsity._4_4_ = param[0xc].field_0.i;
    }
    if (numparam < 0xe) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xd);
      if ((pVVar5->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8da,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xd);
      driftspeed = (pVVar5->field_0).f;
    }
    else {
      if (param[0xd].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8da,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      driftspeed = param[0xd].field_0.f;
    }
    if (numparam < 0xf) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xe);
      if ((pVVar5->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8db,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xe);
      spawnclass = (MetaClass *)(pVVar5->field_0).field_1.a;
    }
    else {
      if (param[0xe].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8db,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      spawnclass = (MetaClass *)param[0xe].field_0.field_1.a;
    }
    if (numparam < 0x10) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xf);
      bVar8 = false;
      if ((pVVar5->field_0).field_3.Type == '\x03') {
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xf);
        bVar8 = true;
        if ((pVVar5->field_0).field_1.atag != 1) {
          pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xf);
          bVar8 = (pVVar5->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar8) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8dc,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xf);
      spawnofs_z = (pVVar5->field_0).f;
    }
    else {
      bVar8 = false;
      if ((param[0xf].field_0.field_3.Type == '\x03') &&
         (bVar8 = true, param[0xf].field_0.field_1.atag != 1)) {
        bVar8 = param[0xf].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar8) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8dc,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      spawnofs_z = param[0xf].field_0.f;
    }
    if (numparam < 0x11) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0x10);
      if ((pVVar5->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8dd,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0x10);
      _limit = (pVVar5->field_0).f;
    }
    else {
      if (param[0x10].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8dd,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      _limit = param[0x10].field_0.f;
    }
    if (numparam < 0x12) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0x11);
      if ((pVVar5->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8de,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0x11);
      t._28_4_ = (pVVar5->field_0).i;
    }
    else {
      if (param[0x11].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8de,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      t._28_4_ = param[0x11].field_0.i;
    }
    if (numparam < 0x13) {
      pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0x12);
      if ((pVVar5->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x8df,
                      "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      TArray<VMValue,_VMValue>::operator[](defaultparam,0x12);
    }
    else if (param[0x12].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8df,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if ((DStack_80.Degrees == 0.0) && (!NAN(DStack_80.Degrees))) {
      DStack_80.Degrees = 8192.0;
    }
    if ((driftspeed == 0.0) && (!NAN(driftspeed))) {
      driftspeed = 1.0;
    }
    FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)&savedpos.Z);
    AActor::Pos((DVector3 *)&saved_angle,this);
    TAngle<double>::TAngle(&saved_pitch,&(this->Angles).Yaw);
    TAngle<double>::TAngle(&local_f8,&(this->Angles).Pitch);
    if ((maxdiff._0_4_ == 0) ||
       (bVar8 = TObjPtr<AActor>::operator==(&this->target,(AActor *)0x0), !bVar8)) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_fc,
                 (int)this +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_fc);
      if (uVar2 != 0) {
        this->visdir = '\x01';
      }
      operator~((int)local_108 + MF_NOSECTOR);
      TFlags<ActorFlag,_unsigned_int>::operator&=(&this->flags,(Self *)(local_108 + 8));
      if (maxdiff._0_4_ != 0) {
        pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
        AActor::AngleTo((AActor *)local_108,this,SUB81(pAVar6,0));
        TAngle<double>::operator=(&(this->Angles).Yaw,(TAngle<double> *)local_108);
      }
      TAngle<double>::TAngle((TAngle<double> *)local_118,&(this->Angles).Yaw);
      TAngle<double>::TAngle(&local_120,60.0);
      if (maxdiff._0_4_ == 0) {
        TObjPtr<AActor>::TObjPtr((TObjPtr<AActor> *)&xydiff.Y,(AActor *)0x0);
      }
      else {
        TObjPtr<AActor>::TObjPtr((TObjPtr<AActor> *)&xydiff.Y,&this->target);
      }
      pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&xydiff.Y);
      P_AimLineAttack((AActor *)(local_118 + 8),(DAngle *)this,2048.0,
                      (FTranslatedLineTarget *)local_118,(DAngle *)&savedpos.Z,(int)&local_120,
                      (AActor *)0x0,pAVar6);
      TAngle<double>::operator=(&(this->Angles).Pitch,(TAngle<double> *)(local_118 + 8));
      if ((savedpos.Z == 0.0) && (maxdiff._0_4_ != 0)) {
        TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
        AActor::Vec2To((AActor *)&zdiff,this);
        pAVar6 = TObjPtr<AActor>::operator->(&this->target);
        dVar9 = AActor::Center(pAVar6);
        dVar10 = AActor::Center(this);
        local_140 = (DThinker *)((dVar9 - dVar10) - this->Floorclip);
        dVar9 = TVector2<double>::Length((TVector2<double> *)&zdiff);
        VecToAngle(dVar9,(double)local_140);
        TAngle<double>::operator-(&local_148);
        TAngle<double>::operator=(&(this->Angles).Pitch,&local_148);
      }
      if (maxdiff._0_4_ != 0) {
        pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
        pAVar7 = TObjPtr<AActor>::operator->(&this->target);
        dVar9 = (pAVar7->Vel).X;
        pAVar7 = TObjPtr<AActor>::operator->(&this->target);
        AActor::AngleTo((AActor *)(local_168 + 0x10),this,-dVar9 * 3.0,-(pAVar7->Vel).Y * 3.0,
                        SUB81(pAVar6,0));
        other = TAngle<double>::operator=(&(this->Angles).Yaw,(TAngle<double> *)(local_168 + 0x10));
        TAngle<double>::operator=(&saved_pitch,other);
        if (maxdiff._0_4_ == 2) {
          dVar9 = (double)(int)color2.field_0;
          dVar10 = TAngle<double>::Cos(&(this->Angles).Yaw);
          dVar11 = (double)(int)color2.field_0;
          dVar12 = TAngle<double>::Sin(&(this->Angles).Yaw);
          AActor::Vec2Offset((AActor *)local_168,dVar9 * dVar10,dVar11 * dVar12,SUB81(this,0));
          AActor::SetXY(this,(DVector2 *)local_168);
          color2.field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)
               (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
          pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
          pAVar7 = TObjPtr<AActor>::operator->(&this->target);
          dVar9 = (pAVar7->Vel).X;
          pAVar7 = TObjPtr<AActor>::operator->(&this->target);
          AActor::AngleTo((AActor *)local_170,this,-dVar9 * 3.0,-(pAVar7->Vel).Y * 3.0,
                          SUB81(pAVar6,0));
          TAngle<double>::operator=(&(this->Angles).Yaw,(TAngle<double> *)local_170);
        }
        pAVar6 = TObjPtr<AActor>::operator->(&this->target);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)((long)&rnd.Degrees + 4),
                   (int)pAVar6 +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&rnd.Degrees + 4));
        if (uVar2 != 0) {
          iVar3 = FRandom::Random2(&pr_crailgun);
          TAngle<double>::TAngle(&local_180,(double)iVar3 * 0.17578125);
          TAngle<double>::TAngle(&local_188,&local_180);
          TAngle<double>::operator+=(&(this->Angles).Yaw,&local_188);
        }
      }
      if ((maxdiff._4_4_ & 4) == 0) {
        iVar3 = FRandom::Random2(&pr_crailgun);
        TAngle<double>::operator*(&local_198,(double)iVar3);
        TAngle<double>::operator/(&local_190,255.0);
        TAngle<double>::operator=(&spread_z,&local_190);
        iVar3 = FRandom::Random2(&pr_crailgun);
        TAngle<double>::operator*((TAngle<double> *)&p.SpiralOffset,(double)iVar3);
        TAngle<double>::operator/(&local_1a0,255.0);
        TAngle<double>::operator=((TAngle<double> *)&range,&local_1a0);
      }
      FRailParams::FRailParams((FRailParams *)local_228);
      p._8_8_ = (BADTYPE)(int)color2.field_0;
      p.offset_xy = _limit;
      local_228 = (undefined1  [8])this;
      p.source._0_4_ = iVar1;
      p.offset_z._0_4_ = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&flags);
      p.offset_z._4_4_ = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&aim);
      p._32_8_ = pufftype;
      p.maxdiff._0_4_ = maxdiff._4_4_;
      p._48_8_ = spread_xy.Degrees;
      TAngle<double>::operator=((TAngle<double> *)&p.puff,&spread_z);
      TAngle<double>::operator=(&p.angleoffset,(TAngle<double> *)&range);
      p.pitchoffset.Degrees = DStack_80.Degrees;
      p.distance._0_4_ = sparsity._4_4_;
      p._88_8_ = driftspeed;
      p.sparsity = (double)spawnclass;
      p.drift = spawnofs_z;
      p.spawnclass._0_4_ = t._28_4_;
      p.spawnclass._4_4_ = 0;
      P_RailAttack((FRailParams *)local_228);
      AActor::SetXYZ(this,(DVector3 *)&saved_angle);
      TAngle<double>::operator=(&(this->Angles).Yaw,&saved_pitch);
      TAngle<double>::operator=(&(this->Angles).Pitch,&local_f8);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x8ce,
                "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomRailgun)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(damage);
	PARAM_INT_DEF	(spawnofs_xy)		
	PARAM_COLOR_DEF	(color1)			
	PARAM_COLOR_DEF	(color2)			
	PARAM_INT_DEF	(flags)				
	PARAM_INT_DEF	(aim)				
	PARAM_FLOAT_DEF	(maxdiff)			
	PARAM_CLASS_DEF	(pufftype, AActor)	
	PARAM_ANGLE_DEF	(spread_xy)			
	PARAM_ANGLE_DEF	(spread_z)			
	PARAM_FLOAT_DEF	(range)				
	PARAM_INT_DEF	(duration)			
	PARAM_FLOAT_DEF	(sparsity)			
	PARAM_FLOAT_DEF	(driftspeed)		
	PARAM_CLASS_DEF	(spawnclass, AActor)
	PARAM_FLOAT_DEF	(spawnofs_z)		
	PARAM_INT_DEF	(SpiralOffset)		
	PARAM_INT_DEF	(limit)				

	if (range == 0) range = 8192.;
	if (sparsity == 0) sparsity = 1;

	FTranslatedLineTarget t;

	DVector3 savedpos = self->Pos();
	DAngle saved_angle = self->Angles.Yaw;
	DAngle saved_pitch = self->Angles.Pitch;

	if (aim && self->target == NULL)
	{
		return 0;
	}
	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = 1;
	}

	self->flags &= ~MF_AMBUSH;


	if (aim)
	{
		self->Angles.Yaw = self->AngleTo(self->target);
	}
	self->Angles.Pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE, &t, 60., 0, aim ? self->target : NULL);
	if (t.linetarget == NULL && aim)
	{
		// We probably won't hit the target, but aim at it anyway so we don't look stupid.
		DVector2 xydiff = self->Vec2To(self->target);
		double zdiff = self->target->Center() - self->Center() - self->Floorclip;
		self->Angles.Pitch = -VecToAngle(xydiff.Length(), zdiff);
	}
	// Let the aim trail behind the player
	if (aim)
	{
		saved_angle = self->Angles.Yaw = self->AngleTo(self->target, -self->target->Vel.X * 3, -self->target->Vel.Y * 3);

		if (aim == CRF_AIMDIRECT)
		{
			// Tricky: We must offset to the angle of the current position
			// but then change the angle again to ensure proper aim.
			self->SetXY(self->Vec2Offset(
				spawnofs_xy * self->Angles.Yaw.Cos(),
				spawnofs_xy * self->Angles.Yaw.Sin()));
			spawnofs_xy = 0;
			self->Angles.Yaw = self->AngleTo(self->target,- self->target->Vel.X * 3, -self->target->Vel.Y * 3);
		}

		if (self->target->flags & MF_SHADOW)
		{
			DAngle rnd = pr_crailgun.Random2() * (45. / 256.);
			self->Angles.Yaw += rnd;
		}
	}

	if (!(flags & CRF_EXPLICITANGLE))
	{
		spread_xy = spread_xy * pr_crailgun.Random2() / 255;
		spread_z = spread_z * pr_crailgun.Random2() / 255;
	}

	FRailParams p;
	p.source = self;
	p.damage = damage;
	p.offset_xy = spawnofs_xy;
	p.offset_z = spawnofs_z;
	p.color1 = color1;
	p.color2 = color2;
	p.maxdiff = maxdiff;
	p.flags = flags;
	p.puff = pufftype;
	p.angleoffset = spread_xy;
	p.pitchoffset = spread_z;
	p.distance = range;
	p.duration = duration;
	p.sparsity = sparsity;
	p.drift = driftspeed;
	p.spawnclass = spawnclass;
	p.SpiralOffset = SpiralOffset;
	p.limit = 0;
	P_RailAttack(&p);

	self->SetXYZ(savedpos);
	self->Angles.Yaw = saved_angle;
	self->Angles.Pitch = saved_pitch;
	return 0;
}